

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
::matches(Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
          *this,candidate_t<wasm::Select_*> candidate)

{
  bool bVar1;
  
  if (candidate->_id == SelectId) {
    if (this->binder != (matched_t<wasm::Select_*> *)0x0) {
      *this->binder = (matched_t<wasm::Select_*>)candidate;
    }
    bVar1 = Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
            ::match((matched_t<wasm::Select_*>)candidate,&this->submatchers);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }